

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPFakeTransmitter::SupportsMulticasting(RTPFakeTransmitter *this)

{
  bool local_19;
  bool v;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if ((this->created & 1U) == 0) {
      local_19 = false;
    }
    else {
      local_19 = (bool)(this->supportsmulticasting & 1);
    }
    this_local._7_1_ = local_19;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPFakeTransmitter::SupportsMulticasting()
{
	if (!init)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (!created)
		v = false;
	else
		v = supportsmulticasting;

	MAINMUTEX_UNLOCK
	return v;
}